

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTools.hpp
# Opt level: O0

size_t Diligent::GetPrintWidth<unsigned_int>(uint Num,uint Base)

{
  undefined8 local_20;
  size_t W;
  uint Base_local;
  uint Num_local;
  
  if (Num == 0) {
    _Base_local = 1;
  }
  else {
    local_20 = 0;
    for (W._4_4_ = Num; W._4_4_ != 0; W._4_4_ = W._4_4_ / Base) {
      local_20 = local_20 + 1;
    }
    _Base_local = local_20;
  }
  return _Base_local;
}

Assistant:

size_t GetPrintWidth(Type Num, Type Base = 10)
{
    if (Num == 0)
        return 1;

    size_t W = Num < 0 ? 1 : 0;
    while (Num != 0)
    {
        ++W;
        Num /= Base;
    }

    return W;
}